

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,uint *params,
          unsigned_long *params_1)

{
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  long lVar1;
  Array<char> local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  str<unsigned_int&>((String *)&local_68,(kj *)params,(uint *)CONCAT44(in_register_00000014,line));
  str<unsigned_long&>(&local_50,(kj *)params_1,params_00);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&local_68.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}